

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall google::protobuf::internal::SooRep::set_size(SooRep *this,bool is_soo,int size)

{
  Nonnull<const_char_*> failure_msg;
  int line;
  bool is_soo_local;
  LogMessageFatal local_20;
  
  local_20.super_LogMessage.errno_saver_.saved_errno_._0_1_ =
       (undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x4) ==
       (undefined1  [16])0x0;
  is_soo_local = is_soo;
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                          (&is_soo_local,(bool *)&local_20,"is_soo == this->is_soo()");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0xd1;
LAB_001587ba:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
  }
  if (is_soo_local == false) {
    (this->field_0).long_rep.size = size;
  }
  else {
    if (3 < size) {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              ((ulong)(uint)size,3,"size <= kSooSizeMask");
      line = 0xd3;
      goto LAB_001587ba;
    }
    (this->field_0).long_rep.elements_int =
         (long)size | (this->field_0).long_rep.elements_int & 0xfffffffffffffff8;
  }
  return;
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_EQ(is_soo, this->is_soo());
    if (is_soo) {
      ABSL_DCHECK_LE(size, kSooSizeMask);
      short_rep.arena_and_size &= kSooPtrMask;
      short_rep.arena_and_size |= size;
    } else {
      long_rep.size = size;
    }
  }